

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.cpp
# Opt level: O2

void __thiscall cppcms::plugin::signature_error::signature_error(signature_error *this,string *msg)

{
  booster::bad_cast::bad_cast(&this->super_bad_cast);
  *(undefined ***)&this->super_bad_cast = &PTR__signature_error_002b8128;
  (this->super_bad_cast).super_backtrace._vptr_backtrace =
       (_func_int **)&PTR__signature_error_002b8150;
  std::__cxx11::string::string((string *)&this->msg_,(string *)msg);
  return;
}

Assistant:

signature_error::signature_error(std::string const &msg) : msg_(msg) {}